

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcemanager.cpp
# Opt level: O2

GLuint __thiscall ResourceManager::getTexture(ResourceManager *this,string *filePath,bool *succes)

{
  _Rb_tree_color _Var1;
  iterator iVar2;
  
  *succes = false;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  *)this,filePath);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->loadedTextures)._M_t._M_impl.super__Rb_tree_header
     ) {
    _Var1 = ~_S_red;
  }
  else {
    *succes = true;
    _Var1 = iVar2._M_node[2]._M_color;
  }
  return _Var1;
}

Assistant:

GLuint ResourceManager::getTexture(std::string filePath, bool& succes)
{
	succes = false;
	std::map<std::string, GLuint>::iterator it;
	it = loadedTextures.find(filePath);
	if (it == loadedTextures.end())
	{
		return -1;
	}
	else
	{
		succes = true;
		return it->second;
	}

}